

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::WildCardJointObservation::operator()
          (WildCardJointObservation *this,iterator_t *str,iterator_t *end)

{
  value_type_conflict1 *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa020bc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa020d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(in_RSI,in_RDX);
  return;
}

Assistant:

void ParserDPOMDPFormat_Spirit::WildCardJointObservation::operator()(iterator_t str, iterator_t end) const
{
    if(DEBUG_PARSE )
        cout << "WildCardJointObservation: _m_lp_JOI.size()="<<_m_po->_m_lp_JOI.size();
    //this (can) contain elements from a failed indiv_action parse.
    _m_po->_m_lp_JO.clear();
    _m_po->_m_lp_JOI.clear();
    //this is different from how we handle joint actions: joint actions are 
    //immediately expanded (i.e. '*'/ANY_INDEX is replaced by all matching
    //indices.) 
    //For joint observations, this is not practical, as for most common reward
    //forms, this is not required. I.e., one will typically specify
    //R: ja : s : * : * : prob 
    //then we want to call addReward(ja,s) and not expand the succesor states
    //and joint observations...

    _m_po->_m_lp_JOI.push_back(_m_po->_m_anyJOIndex);
}